

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

bool __thiscall
RTree<int,_double,_2,_double,_8,_4>::AddBranch
          (RTree<int,_double,_2,_double,_8,_4> *this,Branch *a_branch,Node *a_node,Node **a_newNode)

{
  Node **ppNVar1;
  double *pdVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  long lVar9;
  
  if (a_branch == (Branch *)0x0) {
    __assert_fail("a_branch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                  ,0x425,
                  "bool RTree<int, double, 2>::AddBranch(const Branch *, Node *, Node **) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                 );
  }
  if (a_node != (Node *)0x0) {
    iVar3 = a_node->m_count;
    lVar9 = (long)iVar3;
    if (lVar9 < 8) {
      dVar4 = (a_branch->m_rect).m_min[0];
      dVar5 = (a_branch->m_rect).m_min[1];
      dVar6 = (a_branch->m_rect).m_max[0];
      dVar7 = (a_branch->m_rect).m_max[1];
      uVar8 = *(undefined8 *)&a_branch->m_data;
      ppNVar1 = &a_node->m_branch[lVar9].m_child;
      *ppNVar1 = a_branch->m_child;
      ppNVar1[1] = (Node *)uVar8;
      pdVar2 = a_node->m_branch[lVar9].m_rect.m_max;
      *pdVar2 = dVar6;
      pdVar2[1] = dVar7;
      a_node->m_branch[lVar9].m_rect.m_min[0] = dVar4;
      a_node->m_branch[lVar9].m_rect.m_min[1] = dVar5;
      a_node->m_count = a_node->m_count + 1;
    }
    else {
      if (a_newNode == (Node **)0x0) {
        __assert_fail("a_newNode",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                      ,0x431,
                      "bool RTree<int, double, 2>::AddBranch(const Branch *, Node *, Node **) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                     );
      }
      SplitNode(this,a_node,a_branch,a_newNode);
    }
    return 7 < iVar3;
  }
  __assert_fail("a_node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                ,0x426,
                "bool RTree<int, double, 2>::AddBranch(const Branch *, Node *, Node **) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
               );
}

Assistant:

RTREE_TEMPLATE
bool RTREE_QUAL::AddBranch(const Branch* a_branch, Node* a_node, Node** a_newNode)
{
  ASSERT(a_branch);
  ASSERT(a_node);

  if(a_node->m_count < MAXNODES)  // Split won't be necessary
  {
    a_node->m_branch[a_node->m_count] = *a_branch;
    ++a_node->m_count;

    return false;
  }
  else
  {
    ASSERT(a_newNode);
    
    SplitNode(a_node, a_branch, a_newNode);
    return true;
  }
}